

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_future.c
# Opt level: O2

future_conflict future_create(future_impl impl,future_impl_interface_singleton singleton)

{
  int iVar1;
  future __ptr;
  future_interface pfVar2;
  
  __ptr = (future)malloc(0x10);
  if (__ptr != (future)0x0) {
    __ptr->impl = impl;
    if (singleton == (future_impl_interface_singleton)0x0) {
      __ptr->interface = (future_interface)0x0;
      return __ptr;
    }
    pfVar2 = (*singleton)();
    __ptr->interface = pfVar2;
    if (pfVar2 == (future_interface)0x0) {
      return __ptr;
    }
    if (pfVar2->create == (future_impl_interface_create)0x0) {
      return __ptr;
    }
    iVar1 = (*pfVar2->create)(__ptr,impl);
    if (iVar1 == 0) {
      return __ptr;
    }
    log_write_impl_va("metacall",0x3a,"future_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_future.c"
                      ,3,"Invalid future create callback <%p>",__ptr->interface->create);
    free(__ptr);
  }
  return (future_conflict)0x0;
}

Assistant:

future future_create(future_impl impl, future_impl_interface_singleton singleton)
{
	future f = malloc(sizeof(struct future_type));

	if (f == NULL)
	{
		return NULL;
	}

	f->impl = impl;

	if (singleton)
	{
		f->interface = singleton();
	}
	else
	{
		f->interface = NULL;
	}

	if (f->interface != NULL && f->interface->create != NULL)
	{
		if (f->interface->create(f, impl) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid future create callback <%p>", f->interface->create);

			free(f);

			return NULL;
		}
	}

	return f;
}